

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O0

void test_bson_utf8_nil(void)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  char *str;
  
  bVar1 = bson_utf8_validate("a",3,1);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x5b,"test_bson_utf8_nil","bson_utf8_validate ((const char *) test, 3, true)");
    abort();
  }
  bVar1 = bson_utf8_validate("a",3,0);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x5c,"test_bson_utf8_nil","!bson_utf8_validate ((const char *) test, 3, false)");
    abort();
  }
  pcVar3 = (char *)bson_utf8_escape_for_json("a",0xffffffffffffffff);
  if (pcVar3 != "a") {
    iVar2 = strcmp("a",pcVar3);
    if (iVar2 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n","a",pcVar3);
      abort();
    }
  }
  bson_free(pcVar3);
  pcVar3 = (char *)bson_utf8_escape_for_json("a",3);
  if (pcVar3 != "a\\u0000b") {
    iVar2 = strcmp("a\\u0000b",pcVar3);
    if (iVar2 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n","a\\u0000b",pcVar3);
      abort();
    }
  }
  bson_free(pcVar3);
  return;
}

Assistant:

static void
test_bson_utf8_nil (void)
{
   static const unsigned char test[] = {'a', 0, 'b', 0};
   char *str;

   BSON_ASSERT (bson_utf8_validate ((const char *) test, 3, true));
   BSON_ASSERT (!bson_utf8_validate ((const char *) test, 3, false));

   /* no length provided, stop at first nil */
   str = bson_utf8_escape_for_json ((const char *) test, -1);
   ASSERT_CMPSTR ("a", str);
   bson_free (str);

   str = bson_utf8_escape_for_json ((const char *) test, 3);
   ASSERT_CMPSTR ("a\\u0000b", str);
   bson_free (str);
}